

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,char *s)

{
  istringstream i;
  allocator local_1a9;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::string::string((string *)local_1a8,s,&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,(string *)local_1a8,_S_in);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  parse(this,(istream *)local_188);
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(const char *s)
{
    istringstream i(s);
    return parse(i);
}